

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::Exception::Detail> * __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::operator=
          (ArrayBuilder<kj::Exception::Detail> *this,ArrayBuilder<kj::Exception::Detail> *other)

{
  ArrayBuilder<kj::Exception::Detail> *other_local;
  ArrayBuilder<kj::Exception::Detail> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Detail *)0x0;
  other->pos = (RemoveConst<kj::Exception::Detail> *)0x0;
  other->endPtr = (Detail *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }